

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_helpers.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::csharp::GetPropertyName_abi_cxx11_
          (string *__return_storage_ptr__,csharp *this,FieldDescriptor *descriptor)

{
  initializer_list<const_char_*> iVar1;
  bool bVar2;
  int iVar3;
  flat_hash_set<std::basic_string_view<char,_std::char_traits<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *this_00;
  Descriptor *this_01;
  char *in_RCX;
  FieldDescriptor *extraout_RDX;
  FieldDescriptor *extraout_RDX_00;
  string_view input;
  bool local_181;
  AlphaNum local_140;
  iterator local_110;
  iterator local_100;
  string_view local_f0;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_e0;
  string local_d0;
  undefined1 local_b0 [16];
  undefined1 local_9d;
  undefined1 local_9c;
  allocator<std::basic_string_view<char,_std::char_traits<char>_>_> local_9b;
  key_equal local_9a;
  hasher local_99;
  char *local_98;
  char *pcStack_90;
  char *local_88;
  char *pcStack_80;
  char *local_78;
  char *pcStack_70;
  char *local_68;
  char *pcStack_60;
  char *local_58;
  char *pcStack_50;
  char *local_48;
  iterator local_38;
  size_type local_30;
  FieldDescriptor *local_18;
  FieldDescriptor *descriptor_local;
  string *property_name;
  
  local_18 = (FieldDescriptor *)this;
  descriptor_local = (FieldDescriptor *)__return_storage_ptr__;
  if ((GetPropertyName[abi:cxx11](google::protobuf::FieldDescriptor_const*)::reserved_member_names
       == '\0') &&
     (iVar3 = __cxa_guard_acquire(&GetPropertyName[abi:cxx11](google::protobuf::FieldDescriptor_const*)
                                   ::reserved_member_names), descriptor = extraout_RDX, iVar3 != 0))
  {
    this_00 = (flat_hash_set<std::basic_string_view<char,_std::char_traits<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
               *)operator_new(0x20);
    local_9c = 1;
    local_48 = "Parser";
    local_58 = "MergeFrom";
    pcStack_50 = "OnConstruction";
    local_68 = "Clone";
    pcStack_60 = "CalculateSize";
    local_78 = "GetHashCode";
    pcStack_70 = "WriteTo";
    local_88 = "Equals";
    pcStack_80 = "ToString";
    local_98 = "Types";
    pcStack_90 = "Descriptor";
    local_38 = &local_98;
    local_30 = 0xb;
    std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>::allocator(&local_9b);
    iVar1._M_len = local_30;
    iVar1._M_array = local_38;
    in_RCX = (char *)0x0;
    absl::lts_20250127::
    flat_hash_set<std::basic_string_view<char,_std::char_traits<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ::raw_hash_set(this_00,iVar1,0,&local_99,&local_9a,&local_9b);
    local_9c = 0;
    std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>::~allocator(&local_9b);
    GetPropertyName::reserved_member_names = this_00;
    __cxa_guard_release(&GetPropertyName[abi:cxx11](google::protobuf::FieldDescriptor_const*)::
                         reserved_member_names);
    descriptor = extraout_RDX_00;
  }
  local_9d = 0;
  GetFieldName_abi_cxx11_(&local_d0,(csharp *)local_18,descriptor);
  local_b0 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_d0);
  input._M_len = local_b0._8_8_;
  input._M_str = in_RCX;
  UnderscoresToPascalCase_abi_cxx11_(__return_storage_ptr__,local_b0._0_8_,input);
  std::__cxx11::string::~string((string *)&local_d0);
  local_e0 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
             std::__cxx11::string::operator_cast_to_basic_string_view
                       ((string *)__return_storage_ptr__);
  this_01 = FieldDescriptor::containing_type(local_18);
  local_f0 = Descriptor::name(this_01);
  bVar2 = std::operator==(local_e0,local_f0);
  local_181 = true;
  if (!bVar2) {
    local_100 = (iterator)
                absl::lts_20250127::container_internal::
                raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,std::char_traits<char>>>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                ::find<std::__cxx11::string>
                          ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,std::char_traits<char>>>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                            *)GetPropertyName::reserved_member_names,__return_storage_ptr__);
    local_110 = (iterator)
                absl::lts_20250127::container_internal::
                raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                ::end(&GetPropertyName::reserved_member_names->
                       super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                     );
    local_181 = absl::lts_20250127::container_internal::operator!=
                          ((const_iterator *)&local_100,(const_iterator *)&local_110);
  }
  if (local_181 != false) {
    absl::lts_20250127::AlphaNum::AlphaNum(&local_140,"_");
    absl::lts_20250127::StrAppend(__return_storage_ptr__,&local_140);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GetPropertyName(const FieldDescriptor* descriptor) {
  // Names of members declared or overridden in the message.
  static const auto& reserved_member_names =
      *new absl::flat_hash_set<absl::string_view>(
          {"Types", "Descriptor", "Equals", "ToString", "GetHashCode",
           "WriteTo", "Clone", "CalculateSize", "MergeFrom", "OnConstruction",
           "Parser"});

  // TODO: consider introducing csharp_property_name field option
  std::string property_name = UnderscoresToPascalCase(GetFieldName(descriptor));
  // Avoid either our own type name or reserved names.
  // There are various ways of ending up with naming collisions, but we try to
  // avoid obvious ones. In particular, we avoid the names of all the members we
  // generate. Note that we *don't* add an underscore for MemberwiseClone or
  // GetType. Those generate warnings, but not errors; changing the name now
  // could be a breaking change.
  if (property_name == descriptor->containing_type()->name() ||
      reserved_member_names.find(property_name) !=
          reserved_member_names.end()) {
    absl::StrAppend(&property_name, "_");
  }
  return property_name;
}